

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O0

Mig_Obj_t * Mig_ManObj(Mig_Man_t *p,int v)

{
  int iVar1;
  Mig_Obj_t *pMVar2;
  int v_local;
  Mig_Man_t *p_local;
  
  if ((-1 < v) && (v < p->nObjs)) {
    pMVar2 = Mig_ManPage(p,v);
    iVar1 = Mig_IdCell(v);
    return pMVar2 + iVar1;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmMig.h"
                ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
}

Assistant:

static inline Mig_Obj_t *  Mig_ManObj( Mig_Man_t * p, int v )  { assert(v >= 0 && v < p->nObjs);  return Mig_ManPage(p, v) + Mig_IdCell(v); }